

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

void test_read_num<double,long_long,int(*)(char_const**,double*)>
               (longlong num1,_func_int_char_ptr_ptr_double_ptr *read_f,bool is_ok)

{
  byte bVar1;
  mp_type mVar2;
  int iVar3;
  uint uVar4;
  uint64_t uVar5;
  undefined7 in_register_00000011;
  char *pcVar6;
  long lVar7;
  char *fmt;
  undefined8 uVar8;
  bool bVar9;
  float fVar10;
  double dVar11;
  char *mp_num_pos1;
  char *mp_num_pos2;
  float local_258;
  undefined4 local_254;
  uint64_t local_250;
  double local_248;
  double num2;
  char str [256];
  char mp_nums [16] [16];
  
  local_254 = (undefined4)CONCAT71(in_register_00000011,is_ok);
  builtin_strncpy(str,"typed read of ",0xf);
  iVar3 = snprintf(str + 0xe,0xf2,"%lld",num1);
  pcVar6 = str + (long)iVar3 + 0xe;
  iVar3 = snprintf(pcVar6,(long)mp_nums - (long)pcVar6," into ");
  snprintf(pcVar6 + iVar3,(long)mp_nums - (long)(pcVar6 + iVar3),"double");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fputs(str,_stdout);
  fputc(10,_stdout);
  uVar4 = test_encode_int_all_sizes(mp_nums,num1);
  local_258 = (float)num1;
  local_248 = (double)num1;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  lVar7 = 0;
  local_250 = num1;
  do {
    if ((ulong)uVar4 * 0x10 == lVar7) {
      return;
    }
    pcVar6 = mp_nums[0] + lVar7;
    bVar1 = *pcVar6;
    mVar2 = mp_type_hint[bVar1];
    mp_num_pos1 = pcVar6;
    if (mVar2 == MP_UINT) {
      uVar5 = mp_decode_uint(&mp_num_pos1);
      if (uVar5 != local_250) {
        pcVar6 = "mp_decode_uint(&mp_num_pos1) == (uint64_t)num1";
        uVar8 = 0x72a;
        goto LAB_00125b85;
      }
    }
    else if (mVar2 == MP_FLOAT) {
      fVar10 = mp_decode_float(&mp_num_pos1);
      if ((fVar10 != local_258) || (NAN(fVar10) || NAN(local_258))) {
        pcVar6 = "mp_decode_float(&mp_num_pos1) == (float)num1";
        uVar8 = 0x72d;
        goto LAB_00125b85;
      }
    }
    else if (mVar2 == MP_INT) {
      uVar5 = mp_decode_int(&mp_num_pos1);
      if (uVar5 != local_250) {
        pcVar6 = "mp_decode_int(&mp_num_pos1) == (int64_t)num1";
        uVar8 = 0x727;
LAB_00125b85:
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar6,"false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,uVar8,"test_read_num");
        exit(-1);
      }
    }
    else {
      dVar11 = mp_decode_double(&mp_num_pos1);
      if ((dVar11 != local_248) || (NAN(dVar11) || NAN(local_248))) {
        pcVar6 = "mp_decode_double(&mp_num_pos1) == (double)num1";
        uVar8 = 0x730;
        goto LAB_00125b85;
      }
    }
    num2 = 0.0;
    mp_num_pos2 = pcVar6;
    iVar3 = (*read_f)(&mp_num_pos2,&num2);
    if ((char)local_254 == '\0') {
      _ok((uint)(iVar3 == -1),"rc == -1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar1);
      bVar9 = pcVar6 == mp_num_pos2;
      pcVar6 = "mp_num_pos2 == mp_nums[i]";
      iVar3 = 0x738;
      fmt = "check position";
    }
    else {
      _ok((uint)(iVar3 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar1);
      _ok((uint)(mp_num_pos1 == mp_num_pos2),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      bVar9 = ABS(local_248 - num2) < 1e-15;
      pcVar6 = "double_eq(num1, num2)";
      iVar3 = 0x73e;
      fmt = "check float number";
    }
    _ok((uint)bVar9,pcVar6,
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        iVar3,fmt);
    lVar7 = lVar7 + 0x10;
  } while( true );
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}